

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

bool __thiscall
duckdb::ParquetReader::ScanInternal
          (ParquetReader *this,ClientContext *context,ParquetReaderScanState *state,
          DataChunk *result)

{
  ReadAheadBuffer *this_00;
  set<duckdb::ReadHead_*,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_> *this_01;
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *this_02;
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> *this_03;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *this_04;
  idx_t iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  TableFilter *pTVar3;
  TProtocol *pTVar4;
  ThriftFileTransport *pTVar5;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> _Var6;
  MultiFileLocalColumnId params;
  pointer pcVar7;
  byte bVar8;
  int iVar9;
  ParquetRowGroup *pPVar10;
  pointer pCVar11;
  ParquetReader *pPVar12;
  StructColumnReader *pSVar13;
  pointer pDVar14;
  pointer pAVar15;
  reference pvVar16;
  reference pvVar17;
  reference pvVar18;
  reference pvVar19;
  ColumnReader *pCVar20;
  type pTVar21;
  long lVar22;
  idx_t iVar23;
  undefined4 extraout_var;
  uint64_t len;
  uint64_t uVar24;
  undefined4 extraout_var_00;
  pointer pTVar25;
  _Base_ptr p_Var26;
  InternalException *pIVar27;
  InvalidInputException *this_05;
  IOException *this_06;
  ulong uVar28;
  _Base_ptr p_Var29;
  unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>,_true> *this_07;
  unsigned_long params_1;
  uint uVar30;
  ulong uVar31;
  MultiFileLocalIndex col_idx;
  size_type sVar32;
  _Base_ptr p_Var33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  idx_t filter_count;
  allocator_type local_e1;
  ThriftFileTransport *local_e0;
  SelectionVector *local_d8;
  set<duckdb::ReadHead_*,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_> *local_d0
  ;
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *local_c8;
  string local_c0;
  unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true> *local_98;
  string local_90;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_70;
  ulong local_68;
  vector<duckdb::ParquetScanFilter,_true> *local_60;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (state->finished == false) {
    lVar22 = state->current_group;
    if (lVar22 < 0) {
LAB_01b5b76d:
      state->current_group = lVar22 + 1;
      state->offset_in_group = 0;
      pTVar4 = (state->thrift_file_proto)._M_t.
               super___uniq_ptr_impl<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
               .super__Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false>.
               _M_head_impl;
      pTVar5 = (ThriftFileTransport *)
               (pTVar4->ptrans_).
               super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var2 = (pTVar4->ptrans_).
               super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      this_00 = &pTVar5->ra_buffer;
      ::std::__cxx11::_List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>::_M_clear
                ((_List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_> *)this_00);
      (pTVar5->ra_buffer).read_heads.
      super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
      super__List_node_base._M_prev = (_List_node_base *)this_00;
      (pTVar5->ra_buffer).read_heads.
      super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)this_00;
      (pTVar5->ra_buffer).read_heads.
      super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node._M_size
           = 0;
      this_01 = &(pTVar5->ra_buffer).merge_set;
      ::std::
      _Rb_tree<duckdb::ReadHead_*,_duckdb::ReadHead_*,_std::_Identity<duckdb::ReadHead_*>,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_>
      ::clear(&this_01->_M_t);
      state->current_group_prefetched = false;
      if (state->current_group ==
          (long)(state->group_idx_list).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state->group_idx_list).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) {
LAB_01b5b7ef:
        state->finished = true;
        goto LAB_01b5b7f5;
      }
      this_04 = &state->root_reader;
      local_e0 = pTVar5;
      local_d0 = this_01;
      pCVar11 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
                operator->(this_04);
      pPVar12 = ColumnReader::Reader(pCVar11);
      pvVar16 = vector<unsigned_long,_true>::operator[](&state->group_idx_list,state->current_group)
      ;
      iVar23 = GetRowGroupOffset(pPVar12,*pvVar16);
      state->group_offset = iVar23;
      this_02 = &(this->super_BaseFileReader).column_ids;
      if ((this->super_BaseFileReader).column_ids.column_ids.
          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
          .
          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->super_BaseFileReader).column_ids.column_ids.
          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
          .
          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar31 = 0;
      }
      else {
        uVar31 = 0;
        sVar32 = 0;
        do {
          PrepareRowGroupBuffer(this,state,sVar32);
          pvVar18 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                              (&this_02->column_ids,sVar32);
          iVar23 = pvVar18->column_id;
          pCVar11 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                    ::operator->(this_04);
          pSVar13 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar11);
          pCVar20 = StructColumnReader::GetChildReader(pSVar13,iVar23);
          iVar9 = (*pCVar20->_vptr_ColumnReader[8])(pCVar20);
          uVar31 = uVar31 + CONCAT44(extraout_var,iVar9);
          sVar32 = sVar32 + 1;
        } while (sVar32 < (ulong)((long)(this->super_BaseFileReader).column_ids.column_ids.
                                        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                        .
                                        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->super_BaseFileReader).column_ids.column_ids.
                                        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                        .
                                        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      pPVar10 = GetGroup(this,state);
      if (state->prefetch_mode == false) {
        return true;
      }
      if (state->offset_in_group == pPVar10->num_rows) {
        return true;
      }
      len = GetGroupSpan(this,state);
      if (len < uVar31) {
        this_06 = (IOException *)__cxa_allocate_exception(0x10);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,
                   "The parquet file \'%s\' seems to have incorrectly set page offsets. This interferes with DuckDB\'s prefetching optimization. DuckDB may still be able to scan this file by manually disabling the prefetching mechanism using: \'SET disable_parquet_prefetching=true\'."
                   ,"");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar7 = (this->super_BaseFileReader).file.path._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar7,
                   pcVar7 + (this->super_BaseFileReader).file.path._M_string_length);
        IOException::IOException<std::__cxx11::string>(this_06,&local_c0,&local_50);
        __cxa_throw(this_06,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      _Var6._M_head_impl =
           (this->super_BaseFileReader).filters.
           super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
           .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
      if ((_Var6._M_head_impl != (TableFilterSet *)0x0) ||
         (auVar35._8_4_ = (int)(uVar31 >> 0x20), auVar35._0_8_ = uVar31, auVar35._12_4_ = 0x45300000
         , auVar36._8_4_ = (int)(len >> 0x20), auVar36._0_8_ = len, auVar36._12_4_ = 0x45300000,
         ((auVar35._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar31) - 4503599627370496.0)) /
         ((auVar36._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)len) - 4503599627370496.0)) <= 0.95)) {
        if ((this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          this_03 = &(this->super_BaseFileReader).filters;
          uVar31 = 0;
          do {
            pvVar18 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                                (&this_02->column_ids,uVar31);
            iVar23 = pvVar18->column_id;
            pCVar11 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                      ::operator->(this_04);
            pSVar13 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar11);
            if ((this_03->
                super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
                .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl ==
                (TableFilterSet *)0x0) {
              bVar34 = true;
            }
            else {
              pTVar25 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                        ::operator->(this_03);
              p_Var26 = (pTVar25->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var33 = &(pTVar25->filters)._M_t._M_impl.super__Rb_tree_header._M_header;
              p_Var29 = p_Var33;
              if (p_Var26 != (_Base_ptr)0x0) {
                do {
                  if (*(ulong *)(p_Var26 + 1) >= uVar31) {
                    p_Var29 = p_Var26;
                  }
                  p_Var26 = (&p_Var26->_M_left)[*(ulong *)(p_Var26 + 1) < uVar31];
                } while (p_Var26 != (_Base_ptr)0x0);
                if ((p_Var29 != p_Var33) && (*(ulong *)(p_Var29 + 1) <= uVar31)) {
                  p_Var33 = p_Var29;
                }
              }
              pTVar25 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                        ::operator->(this_03);
              bVar34 = (_Rb_tree_header *)p_Var33 ==
                       &(pTVar25->filters)._M_t._M_impl.super__Rb_tree_header;
            }
            pCVar20 = StructColumnReader::GetChildReader(pSVar13,iVar23);
            (*pCVar20->_vptr_ColumnReader[10])
                      (pCVar20,local_e0,
                       (ulong)(byte)(bVar34 ^ 1U | _Var6._M_head_impl == (TableFilterSet *)0x0));
            uVar31 = uVar31 + 1;
          } while (uVar31 < (ulong)((long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        ::std::
        _Rb_tree<duckdb::ReadHead_*,_duckdb::ReadHead_*,_std::_Identity<duckdb::ReadHead_*>,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_>
        ::clear(&local_d0->_M_t);
        if (_Var6._M_head_impl == (TableFilterSet *)0x0) {
          ReadAheadBuffer::Prefetch(this_00);
        }
      }
      else if (state->current_group_prefetched == false) {
        uVar24 = GetGroupCompressedSize(this,state);
        if (uVar24 != 0) {
          iVar23 = GetGroupOffset(this,state);
          ThriftFileTransport::Prefetch(local_e0,iVar23,len);
        }
        state->current_group_prefetched = true;
      }
    }
    else {
      iVar23 = state->offset_in_group;
      pPVar10 = GetGroup(this,state);
      if (pPVar10->num_rows <= (long)iVar23) {
        lVar22 = state->current_group;
        goto LAB_01b5b76d;
      }
      pPVar10 = GetGroup(this,state);
      iVar23 = pPVar10->num_rows;
      iVar1 = state->offset_in_group;
      params_1 = iVar23 - iVar1;
      if (0x7ff < params_1) {
        params_1 = 0x800;
      }
      result->count = params_1;
      if (iVar23 == iVar1) goto LAB_01b5b7ef;
      pCVar11 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
                operator->(&state->root_reader);
      pPVar12 = ColumnReader::Reader(pCVar11);
      switchD_01043a80::default
                ((state->define_buf).super_ByteBuffer.ptr,0,(state->define_buf).super_ByteBuffer.len
                );
      switchD_01043a80::default
                ((state->repeat_buf).super_ByteBuffer.ptr,0,(state->repeat_buf).super_ByteBuffer.len
                );
      local_e0 = (ThriftFileTransport *)(state->define_buf).super_ByteBuffer.ptr;
      local_d0 = (set<duckdb::ReadHead_*,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_>
                  *)(state->repeat_buf).super_ByteBuffer.ptr;
      pCVar11 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
                operator->(&state->root_reader);
      pSVar13 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar11);
      if ((pPVar12->super_BaseFileReader).deletion_filter.
          super_unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>._M_t.
          super___uniq_ptr_impl<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::DeleteFilter_*,_std::default_delete<duckdb::DeleteFilter>_>
          .super__Head_base<0UL,_duckdb::DeleteFilter_*,_false>._M_head_impl == (DeleteFilter *)0x0
          && (this->super_BaseFileReader).filters.
             super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
             .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl ==
             (TableFilterSet *)0x0) {
        if ((this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_c8 = &(this->super_BaseFileReader).column_ids;
          sVar32 = 0;
          do {
            pvVar18 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                                (&local_c8->column_ids,sVar32);
            params.column_id = pvVar18->column_id;
            pvVar19 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar32);
            pCVar20 = StructColumnReader::GetChildReader(pSVar13,params.column_id);
            iVar9 = (*pCVar20->_vptr_ColumnReader[3])(pCVar20,params_1,local_e0,local_d0,pvVar19);
            if (CONCAT44(extraout_var_00,iVar9) != params_1) {
              this_05 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c0,
                         "Mismatch in parquet read for column %llu, expected %llu rows, got %llu",""
                        );
              InvalidInputException::
              InvalidInputException<duckdb::MultiFileLocalColumnId,unsigned_long,unsigned_long>
                        (this_05,&local_c0,params,params_1,CONCAT44(extraout_var_00,iVar9));
              __cxa_throw(this_05,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            sVar32 = sVar32 + 1;
          } while (sVar32 < (ulong)((long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
      else {
        filter_count = result->count;
        local_90._M_dataplus._M_p._0_1_ = 1;
        ::std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)&local_c0,
                   (long)(this->super_BaseFileReader).column_ids.column_ids.
                         super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         .
                         super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_BaseFileReader).column_ids.column_ids.
                         super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         .
                         super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_90,&local_e1)
        ;
        this_07 = &(pPVar12->super_BaseFileReader).deletion_filter;
        local_d8 = &state->sel;
        p_Var2 = (state->sel).selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (state->sel).selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (state->sel).selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        local_d8->sel_vector = (sel_t *)0x0;
        bVar34 = (this_07->
                 super_unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>)
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::DeleteFilter_*,_std::default_delete<duckdb::DeleteFilter>_>
                 .super__Head_base<0UL,_duckdb::DeleteFilter_*,_false>._M_head_impl ==
                 (DeleteFilter *)0x0;
        uVar30 = (uint)bVar34;
        if (!bVar34) {
          iVar23 = state->offset_in_group;
          iVar1 = state->group_offset;
          pDVar14 = unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>,_true>
                    ::operator->(this_07);
          filter_count = (**(code **)(*(long *)pDVar14 + 0x10))
                                   (pDVar14,iVar1 + iVar23,params_1,local_d8);
        }
        local_c8 = &(this->super_BaseFileReader).column_ids;
        if ((this->super_BaseFileReader).filters.
            super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
            .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl !=
            (TableFilterSet *)0x0) {
          local_98 = &state->adaptive_filter;
          pAVar15 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                    ::operator->(local_98);
          local_70.__d.__r = (duration)AdaptiveFilter::BeginFilter(pAVar15);
          if (((state->scan_filters).
               super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>.
               super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               (state->scan_filters).
               super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>.
               super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
               ._M_impl.super__Vector_impl_data._M_start) && (filter_count != 0)) {
            local_60 = &state->scan_filters;
            uVar31 = 1;
            local_68 = 0x800000000000003f;
            do {
              pAVar15 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                        ::operator->(local_98);
              pvVar16 = vector<unsigned_long,_true>::operator[](&pAVar15->permutation,uVar31 - 1);
              pvVar17 = vector<duckdb::ParquetScanFilter,_true>::operator[](local_60,*pvVar16);
              uVar28 = pvVar17->filter_idx;
              pvVar18 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                                  (&local_c8->column_ids,uVar28);
              iVar23 = pvVar18->column_id;
              local_58 = uVar31;
              pvVar19 = vector<duckdb::Vector,_true>::operator[](&result->data,uVar28);
              pCVar20 = StructColumnReader::GetChildReader(pSVar13,iVar23);
              pTVar3 = pvVar17->filter;
              pTVar21 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                        ::operator*(&pvVar17->filter_state);
              (*pCVar20->_vptr_ColumnReader[5])
                        (pCVar20,params_1,local_e0,local_d0,pvVar19,pTVar3,pTVar21,local_d8,
                         &filter_count,(ulong)uVar30);
              uVar31 = (ulong)(uint)local_c0.field_2._8_4_ +
                       (local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p) *
                       8;
              if (uVar31 <= uVar28) {
                pIVar27 = (InternalException *)__cxa_allocate_exception(0x10);
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_90,
                           "Attempted to access index %ld within vector of size %ld","");
                InternalException::InternalException<unsigned_long,unsigned_long>
                          (pIVar27,&local_90,uVar28,uVar31);
                __cxa_throw(pIVar27,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              uVar31 = uVar28 + 0x3f;
              if (-1 < (long)uVar28) {
                uVar31 = uVar28;
              }
              bVar8 = (byte)uVar28 & 0x3f;
              *(ulong *)(local_c0._M_dataplus._M_p +
                        (ulong)((uVar28 & local_68) < 0x8000000000000001) * 8 +
                        ((long)uVar31 >> 6) * 8 + -8) =
                   *(ulong *)(local_c0._M_dataplus._M_p +
                             (ulong)((uVar28 & local_68) < 0x8000000000000001) * 8 +
                             ((long)uVar31 >> 6) * 8 + -8) &
                   (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
              if ((ulong)(((long)(state->scan_filters).
                                 super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                 .
                                 super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(state->scan_filters).
                                 super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                 .
                                 super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555) <= local_58) break;
              uVar31 = local_58 + 1;
              uVar30 = 0;
            } while (filter_count != 0);
          }
          pAVar15 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                    ::operator->(local_98);
          AdaptiveFilter::EndFilter(pAVar15,(AdaptiveFilterState)local_70.__d.__r);
        }
        if ((this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->super_BaseFileReader).column_ids.column_ids.
            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            .
            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar31 = 0;
          do {
            uVar28 = (ulong)(uint)local_c0.field_2._8_4_ +
                     (local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p) * 8;
            if (uVar28 <= uVar31) {
              pIVar27 = (InternalException *)__cxa_allocate_exception(0x10);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,
                         "Attempted to access index %ld within vector of size %ld","");
              InternalException::InternalException<unsigned_long,unsigned_long>
                        (pIVar27,&local_90,uVar31,uVar28);
              __cxa_throw(pIVar27,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            uVar28 = uVar31 + 0x3f;
            if (-1 < (long)uVar31) {
              uVar28 = uVar31;
            }
            if ((*(ulong *)(local_c0._M_dataplus._M_p +
                           (ulong)((uVar31 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                           ((long)uVar28 >> 6) * 8 + -8) >> (uVar31 & 0x3f) & 1) != 0) {
              pvVar18 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                                  (&local_c8->column_ids,uVar31);
              iVar23 = pvVar18->column_id;
              if (filter_count == 0) {
                pCVar20 = StructColumnReader::GetChildReader(pSVar13,iVar23);
                (*pCVar20->_vptr_ColumnReader[6])(pCVar20,result->count);
              }
              else {
                pvVar19 = vector<duckdb::Vector,_true>::operator[](&result->data,uVar31);
                pCVar20 = StructColumnReader::GetChildReader(pSVar13,iVar23);
                (*pCVar20->_vptr_ColumnReader[4])
                          (pCVar20,result->count,local_e0,local_d0,pvVar19,local_d8,filter_count);
              }
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 < (ulong)((long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->super_BaseFileReader).column_ids.column_ids.
                                          super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          .
                                          super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        if (params_1 != filter_count) {
          DataChunk::Slice(result,local_d8,filter_count);
        }
        if (local_c0._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
      LOCK();
      (this->rows_read).super___atomic_base<unsigned_long>._M_i =
           (this->rows_read).super___atomic_base<unsigned_long>._M_i + params_1;
      UNLOCK();
      state->offset_in_group = state->offset_in_group + params_1;
    }
    bVar34 = true;
  }
  else {
LAB_01b5b7f5:
    bVar34 = false;
  }
  return bVar34;
}

Assistant:

bool ParquetReader::ScanInternal(ClientContext &context, ParquetReaderScanState &state, DataChunk &result) {
	if (state.finished) {
		return false;
	}

	// see if we have to switch to the next row group in the parquet file
	if (state.current_group < 0 || (int64_t)state.offset_in_group >= GetGroup(state).num_rows) {
		state.current_group++;
		state.offset_in_group = 0;

		auto &trans = reinterpret_cast<ThriftFileTransport &>(*state.thrift_file_proto->getTransport());
		trans.ClearPrefetch();
		state.current_group_prefetched = false;

		if ((idx_t)state.current_group == state.group_idx_list.size()) {
			state.finished = true;
			return false;
		}

		// TODO: only need this if we have a deletion vector?
		state.group_offset = GetRowGroupOffset(state.root_reader->Reader(), state.group_idx_list[state.current_group]);

		uint64_t to_scan_compressed_bytes = 0;
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto col_idx = MultiFileLocalIndex(i);
			PrepareRowGroupBuffer(state, col_idx);

			auto file_col_idx = column_ids[col_idx];

			auto &root_reader = state.root_reader->Cast<StructColumnReader>();
			to_scan_compressed_bytes += root_reader.GetChildReader(file_col_idx).TotalCompressedSize();
		}

		auto &group = GetGroup(state);
		if (state.prefetch_mode && state.offset_in_group != (idx_t)group.num_rows) {
			uint64_t total_row_group_span = GetGroupSpan(state);

			double scan_percentage = (double)(to_scan_compressed_bytes) / static_cast<double>(total_row_group_span);

			if (to_scan_compressed_bytes > total_row_group_span) {
				throw IOException(
				    "The parquet file '%s' seems to have incorrectly set page offsets. This interferes with DuckDB's "
				    "prefetching optimization. DuckDB may still be able to scan this file by manually disabling the "
				    "prefetching mechanism using: 'SET disable_parquet_prefetching=true'.",
				    GetFileName());
			}

			if (!filters && scan_percentage > ParquetReaderPrefetchConfig::WHOLE_GROUP_PREFETCH_MINIMUM_SCAN) {
				// Prefetch the whole row group
				if (!state.current_group_prefetched) {
					auto total_compressed_size = GetGroupCompressedSize(state);
					if (total_compressed_size > 0) {
						trans.Prefetch(GetGroupOffset(state), total_row_group_span);
					}
					state.current_group_prefetched = true;
				}
			} else {
				// lazy fetching is when all tuples in a column can be skipped. With lazy fetching the buffer is only
				// fetched on the first read to that buffer.
				bool lazy_fetch = filters != nullptr;

				// Prefetch column-wise
				for (idx_t i = 0; i < column_ids.size(); i++) {
					auto col_idx = MultiFileLocalIndex(i);
					auto file_col_idx = column_ids[col_idx];
					auto &root_reader = state.root_reader->Cast<StructColumnReader>();

					bool has_filter = false;
					if (filters) {
						auto entry = filters->filters.find(col_idx);
						has_filter = entry != filters->filters.end();
					}
					root_reader.GetChildReader(file_col_idx).RegisterPrefetch(trans, !(lazy_fetch && !has_filter));
				}

				trans.FinalizeRegistration();

				if (!lazy_fetch) {
					trans.PrefetchRegistered();
				}
			}
		}
		return true;
	}

	auto scan_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, GetGroup(state).num_rows - state.offset_in_group);
	result.SetCardinality(scan_count);

	if (scan_count == 0) {
		state.finished = true;
		return false; // end of last group, we are done
	}

	auto &deletion_filter = state.root_reader->Reader().deletion_filter;

	state.define_buf.zero();
	state.repeat_buf.zero();

	auto define_ptr = (uint8_t *)state.define_buf.ptr;
	auto repeat_ptr = (uint8_t *)state.repeat_buf.ptr;

	auto &root_reader = state.root_reader->Cast<StructColumnReader>();

	if (filters || deletion_filter) {
		idx_t filter_count = result.size();
		D_ASSERT(filter_count == scan_count);
		vector<bool> need_to_read(column_ids.size(), true);

		state.sel.Initialize(nullptr);
		D_ASSERT(!filters || state.scan_filters.size() == filters->filters.size());

		bool is_first_filter = true;
		if (deletion_filter) {
			auto row_start = UnsafeNumericCast<row_t>(state.offset_in_group + state.group_offset);
			filter_count = deletion_filter->Filter(row_start, scan_count, state.sel);
			//! FIXME: does this need to be set?
			//! As part of 'DirectFilter' we also initialize reads of the child readers
			is_first_filter = false;
		}

		if (filters) {
			// first load the columns that are used in filters
			auto filter_state = state.adaptive_filter->BeginFilter();
			for (idx_t i = 0; i < state.scan_filters.size(); i++) {
				if (filter_count == 0) {
					// if no rows are left we can stop checking filters
					break;
				}
				auto &scan_filter = state.scan_filters[state.adaptive_filter->permutation[i]];
				auto local_idx = MultiFileLocalIndex(scan_filter.filter_idx);
				auto column_id = column_ids[local_idx];

				auto &result_vector = result.data[local_idx.GetIndex()];
				auto &child_reader = root_reader.GetChildReader(column_id);
				child_reader.Filter(scan_count, define_ptr, repeat_ptr, result_vector, scan_filter.filter,
				                    *scan_filter.filter_state, state.sel, filter_count, is_first_filter);
				need_to_read[local_idx.GetIndex()] = false;
				is_first_filter = false;
			}
			state.adaptive_filter->EndFilter(filter_state);
		}

		// we still may have to read some cols
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto col_idx = MultiFileLocalIndex(i);
			if (!need_to_read[col_idx]) {
				continue;
			}
			auto file_col_idx = column_ids[col_idx];
			if (filter_count == 0) {
				root_reader.GetChildReader(file_col_idx).Skip(result.size());
				continue;
			}
			auto &result_vector = result.data[i];
			auto &child_reader = root_reader.GetChildReader(file_col_idx);
			child_reader.Select(result.size(), define_ptr, repeat_ptr, result_vector, state.sel, filter_count);
		}
		if (scan_count != filter_count) {
			result.Slice(state.sel, filter_count);
		}
	} else {
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto col_idx = MultiFileLocalIndex(i);
			auto file_col_idx = column_ids[col_idx];
			auto &result_vector = result.data[i];
			auto &child_reader = root_reader.GetChildReader(file_col_idx);
			auto rows_read = child_reader.Read(scan_count, define_ptr, repeat_ptr, result_vector);
			if (rows_read != scan_count) {
				throw InvalidInputException("Mismatch in parquet read for column %llu, expected %llu rows, got %llu",
				                            file_col_idx, scan_count, rows_read);
			}
		}
	}

	rows_read += scan_count;
	state.offset_in_group += scan_count;
	return true;
}